

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O0

void __thiscall Display::Display(Display *this,char *filebase)

{
  ofstream *this_00;
  char *pcVar1;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_19;
  char *local_18;
  char *filebase_local;
  Display *this_local;
  
  local_18 = filebase;
  filebase_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,filebase,&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::vector<Plot,_std::allocator<Plot>_>::vector(&this->vPlots);
  std::__cxx11::string::string((string *)&this->sTitle);
  std::__cxx11::string::string((string *)&this->sUserSettings);
  std::__cxx11::string::string((string *)&this->sXFont);
  std::__cxx11::string::string((string *)&this->sYFont);
  std::__cxx11::string::string((string *)&this->sZFont);
  std::__cxx11::string::string((string *)&this->sXTicFont);
  std::__cxx11::string::string((string *)&this->sYTicFont);
  std::__cxx11::string::string((string *)&this->sZTicFont);
  this->pFile = (ofstream *)0x0;
  this_00 = (ofstream *)operator_new(0x200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,".gnuplot",&local_71);
  std::operator+(&local_50,&this->sFileBase,&local_70);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(this_00,pcVar1,_S_trunc);
  this->pFile = this_00;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  this->nMode = 0;
  return;
}

Assistant:

Display::Display(const char *filebase) : sFileBase( filebase )
{
	pFile = 0;
	pFile = new ofstream( (sFileBase + string(".gnuplot")).c_str(), ios_base::trunc );
	nMode = 0;
}